

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::FunctionObject::
binary<tcu::Vector<double,_4>,_tcu::Vector<double,_4>,_tcu::Vector<double,_4>_>::call
          (binary<tcu::Vector<double,_4>,_tcu::Vector<double,_4>,_tcu::Vector<double,_4>_> *this,
          GLvoid *result_dst,GLvoid *argument_src)

{
  undefined4 *puVar1;
  code *pcVar2;
  GLuint GVar3;
  Vector<double,_4> result;
  Vector<double,_4> arg_2;
  Vector<double,_4> arg_1;
  Vector<double,_4> local_b8;
  Vector<double,_4> local_98;
  Vector<double,_4> local_78;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  GVar3 = GPUShaderFP64Test10::functionObject::getArgumentStride((functionObject *)this,0);
  pcVar2 = (code *)(this->super_binaryBase).super_functionObject.m_p_function;
  tcu::Vector<double,_4>::Vector(&local_78);
  tcu::Vector<double,_4>::Vector(&local_98);
  tcu::Vector<double,_4>::Vector(&local_b8);
  local_78.m_data[0] = *argument_src;
  local_78.m_data[1] = *(double *)((long)argument_src + 8);
  local_78.m_data[2] = *(double *)((long)argument_src + 0x10);
  local_78.m_data[3] = *(double *)((long)argument_src + 0x18);
  puVar1 = (undefined4 *)((long)argument_src + (ulong)GVar3);
  local_98.m_data[0]._0_4_ = *puVar1;
  local_98.m_data[0]._4_4_ = puVar1[1];
  local_98.m_data[1]._0_4_ = puVar1[2];
  local_98.m_data[1]._4_4_ = puVar1[3];
  puVar1 = (undefined4 *)((long)argument_src + (ulong)GVar3 + 0x10);
  local_98.m_data[2]._0_4_ = *puVar1;
  local_98.m_data[2]._4_4_ = puVar1[1];
  local_98.m_data[3]._0_4_ = puVar1[2];
  local_98.m_data[3]._4_4_ = puVar1[3];
  (*pcVar2)(&local_50,&local_78,&local_98);
  *(undefined8 *)((long)result_dst + 0x10) = local_40;
  *(undefined8 *)((long)result_dst + 0x18) = uStack_38;
  *(undefined8 *)result_dst = local_50;
  *(undefined8 *)((long)result_dst + 8) = uStack_48;
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		const glw::GLuint argument_1_stride = getArgumentStride(0);

		functionPointer p_function = (functionPointer)m_p_function;

		Arg1T arg_1;
		Arg2T arg_2;
		ResT  result;

		unpack<Arg1T>::get(argument_src, arg_1);
		unpack<Arg2T>::get((glw::GLubyte*)argument_src + argument_1_stride, arg_2);

		result = p_function(arg_1, arg_2);

		pack<ResT>::set(result_dst, result);
	}